

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keywords.cpp
# Opt level: O0

SyntaxKind psy::C::translate5(char *s)

{
  char *s_local;
  
  if (*s == 'b') {
    if ((((s[1] == 'i') && (s[2] == 't')) && (s[3] == 'o')) && (s[4] == 'r')) {
      return BarToken;
    }
  }
  else if (*s == 'c') {
    if (((s[1] == 'o') && (s[2] == 'm')) && ((s[3] == 'p' && (s[4] == 'l')))) {
      return OperatorName_COMPLToken;
    }
  }
  else if ((((*s == 'o') && (s[1] == 'r')) && (s[2] == '_')) && ((s[3] == 'e' && (s[4] == 'q')))) {
    return BarEqualsToken;
  }
  return IdentifierToken;
}

Assistant:

static inline SyntaxKind translate5(const char* s)
{
    if (s[0] == 'b') {
        if (s[1] == 'i') {
            if (s[2] == 't') {
                if (s[3] == 'o') {
                    if (s[4] == 'r') {
                        return SyntaxKind::OperatorName_BITORToken;
                    }
                }
            }
        }
    }
    else if (s[0] == 'c') {
        if (s[1] == 'o') {
            if (s[2] == 'm') {
                if (s[3] == 'p') {
                    if (s[4] == 'l') {
                        return SyntaxKind::OperatorName_COMPLToken;
                    }
                }
            }
        }
    }
    else if (s[0] == 'o') {
        if (s[1] == 'r') {
            if (s[2] == '_') {
                if (s[3] == 'e') {
                    if (s[4] == 'q') {
                        return SyntaxKind::OperatorName_OREQToken;
                    }
                }
            }
        }
    }
    return SyntaxKind::IdentifierToken;
}